

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

bool __thiscall flatbuffers::php::PhpGenerator::GenerateEnums(PhpGenerator *this)

{
  pointer ppEVar1;
  EnumDef *enum_def;
  pointer ppEVar2;
  bool bVar3;
  pointer ppEVar4;
  string enumcode;
  string local_50;
  
  ppEVar2 = (((this->super_BaseGenerator).parser_)->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    ppEVar4 = ppEVar2;
    ppEVar1 = (((this->super_BaseGenerator).parser_)->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar4 == ppEVar1) break;
    enum_def = *ppEVar4;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    GenEnum(enum_def,&local_50);
    bVar3 = SaveType(this,&enum_def->super_Definition,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    ppEVar2 = ppEVar4 + 1;
  } while (bVar3);
  return ppEVar4 == ppEVar1;
}

Assistant:

bool GenerateEnums() {
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      auto &enum_def = **it;
      std::string enumcode;
      GenEnum(enum_def, &enumcode);
      if (!SaveType(enum_def, enumcode, false)) return false;
    }
    return true;
  }